

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O0

void calc_mean_and_sd_weighted<double,unsigned_long,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,double>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,unsigned_long *Xc_ind,
               unsigned_long *Xc_indptr,double *x_sd,double *x_mean,
               robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
               *w)

{
  double __x;
  size_t sVar1;
  pointer pbVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  buckets_container_type *this;
  double *pdVar6;
  unsigned_long *puVar7;
  long in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  double dVar8;
  size_t *row_1;
  double w_this;
  double m_prev;
  double s;
  double m;
  double added;
  size_t row;
  double cnt;
  size_t *ptr_st;
  size_t ind_end_col;
  size_t curr_pos;
  size_t end_col;
  size_t st_col;
  undefined6 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5e;
  byte bVar9;
  undefined1 in_stack_ffffffffffffff5f;
  undefined1 uVar10;
  robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *in_stack_ffffffffffffff60;
  unsigned_long *in_stack_ffffffffffffff70;
  unsigned_long *__val;
  unsigned_long *in_stack_ffffffffffffff78;
  unsigned_long *__last;
  unsigned_long *in_stack_ffffffffffffff80;
  unsigned_long *puVar11;
  double local_78;
  ulong local_70;
  double local_68;
  size_t local_48;
  
  if (row_1[in_RCX] == row_1[in_RCX + 1]) {
    *(undefined8 *)w_this = 0;
    *(undefined8 *)m_prev = 0;
  }
  else {
    local_48 = row_1[in_RCX];
    sVar1 = row_1[in_RCX + 1];
    sVar5 = sVar1 - 1;
    pbVar2 = *(pointer *)(in_R9 + sVar5 * 8);
    this = (buckets_container_type *)
           std::lower_bound<unsigned_long*,unsigned_long>
                     (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70)
    ;
    local_68 = 0.0;
    for (local_70 = in_RSI; local_70 <= in_RDX; local_70 = local_70 + 1) {
      pdVar6 = tsl::
               robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
               ::operator[](in_stack_ffffffffffffff60,
                            (unsigned_long *)
                            CONCAT17(in_stack_ffffffffffffff5f,
                                     CONCAT16(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58)))
      ;
      local_68 = *pdVar6 + local_68;
    }
    local_78 = 0.0;
    puVar11 = (unsigned_long *)0x0;
    __last = (unsigned_long *)0x0;
    __val = (unsigned_long *)0x0;
    while( true ) {
      uVar10 = false;
      if ((this != (buckets_container_type *)(in_RDI + in_RDX * 8 + 8)) &&
         (uVar10 = false, local_48 != sVar1)) {
        uVar10 = (this->
                 super__Vector_base<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>_>_>
                 )._M_impl.super__Vector_impl_data._M_start <= pbVar2;
      }
      if ((bool)uVar10 == false) break;
      if (*(pointer *)(in_R9 + local_48 * 8) ==
          (this->
          super__Vector_base<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>_>_>
          )._M_impl.super__Vector_impl_data._M_start) {
        uVar3 = std::isnan(*(double *)(in_R8 + local_48 * 8));
        bVar9 = 1;
        if ((uVar3 & 1) == 0) {
          iVar4 = std::isinf(*(double *)(in_R8 + local_48 * 8));
          bVar9 = (byte)iVar4;
        }
        if ((bVar9 & 1) == 0) {
          pdVar6 = tsl::
                   robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                   ::operator[]((robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                                 *)this,(unsigned_long *)
                                        CONCAT17(uVar10,CONCAT16(bVar9,in_stack_ffffffffffffff58)));
          __x = *pdVar6;
          if ((local_78 == 0.0) && (!NAN(local_78))) {
            __val = *(unsigned_long **)(in_R8 + local_48 * 8);
          }
          local_78 = __x + local_78;
          puVar11 = (unsigned_long *)
                    fma(__x,(*(double *)(in_R8 + local_48 * 8) - (double)puVar11) / local_78,
                        (double)puVar11);
          dVar8 = *(double *)(in_R8 + local_48 * 8) - (double)__val;
          __val = puVar11;
          __last = (unsigned_long *)
                   fma(__x,(*(double *)(in_R8 + local_48 * 8) - (double)puVar11) * dVar8,
                       (double)__last);
          puVar11 = __val;
        }
        else {
          pdVar6 = tsl::
                   robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                   ::operator[]((robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                                 *)this,(unsigned_long *)
                                        CONCAT17(uVar10,CONCAT16(bVar9,in_stack_ffffffffffffff58)));
          local_68 = local_68 - *pdVar6;
        }
        if (((robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
              *)this ==
             (robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
              *)(in_RDI + in_RDX * 8)) || (local_48 == sVar5)) break;
        this = &((ht *)&this->
                        super__Vector_base<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>_>_>
                )->m_buckets_data;
        puVar7 = std::lower_bound<unsigned_long*,unsigned_long>(puVar11,__last,__val);
        local_48 = (long)puVar7 - in_R9 >> 3;
      }
      else if ((this->
               super__Vector_base<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>_>_>
               )._M_impl.super__Vector_impl_data._M_start < *(pointer *)(in_R9 + local_48 * 8)) {
        this = (buckets_container_type *)
               std::lower_bound<unsigned_long*,unsigned_long>(puVar11,__last,__val);
      }
      else {
        puVar7 = std::lower_bound<unsigned_long*,unsigned_long>(puVar11,__last,__val);
        local_48 = (long)puVar7 - in_R9 >> 3;
      }
    }
    if ((local_78 != 0.0) || (NAN(local_78))) {
      if (local_78 < local_68) {
        __last = (unsigned_long *)
                 ((double)puVar11 * (double)puVar11 * local_78 * (1.0 - local_78 / local_68) +
                 (double)__last);
        puVar11 = (unsigned_long *)((local_78 / local_68) * (double)puVar11);
      }
      *(unsigned_long **)m_prev = puVar11;
      *(double *)w_this = SQRT((double)__last / local_68);
    }
    else {
      *(undefined8 *)m_prev = 0;
      *(undefined8 *)w_this = 0;
    }
  }
  return;
}

Assistant:

void calc_mean_and_sd_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                               real_t_ *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                               double &restrict x_sd, double &restrict x_mean, mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
    {
        x_sd   = 0;
        x_mean = 0;
        return;
    }
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = (size_t) Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, (size_t)Xc_ind[st_col]);

    ldouble_safe cnt = 0.;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];
    ldouble_safe added = 0;
    ldouble_safe m = 0;
    ldouble_safe s = 0;
    ldouble_safe m_prev = 0;
    ldouble_safe w_this;

    for (size_t *row = ptr_st;
         row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
        )
    {
        if (Xc_ind[curr_pos] == (sparse_ix)(*row))
        {
            if (unlikely(is_na_or_inf(Xc[curr_pos])))
            {
                cnt -= w[*row];
            }

            else
            {
                w_this = w[*row];
                if (added == 0) m_prev = Xc[curr_pos];
                added += w_this;
                m = std::fma(w_this, (Xc[curr_pos] - m) / added, m);
                s = std::fma(w_this, (Xc[curr_pos] - m) * (Xc[curr_pos] - m_prev), s);
                m_prev = m;
            }

            if (row == ix_arr + end || curr_pos == end_col) break;
            curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
        }

        else
        {
            if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
            else
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
        }
    }

    if (added == 0)
    {
        x_mean = 0;
        x_sd = 0;
        return;
    }

    /* Note: up to this point:
         m = sum(x)/nnz
         s = sum(x^2) - (1/nnz)*(sum(x)^2)
       Here the standard deviation is given by:
         sigma = (1/n)*(sum(x^2) - (1/n)*(sum(x)^2))
       The difference can be put to a closed form. */
    if (cnt > added)
    {
        s += square(m) * (added * ((ldouble_safe)1 - (ldouble_safe)added/(ldouble_safe)cnt));
        m *= added / cnt;
    }

    x_mean = m;
    x_sd   = std::sqrt(s / (ldouble_safe)cnt);
}